

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPHandler.h
# Opt level: O2

void __thiscall HTTPHandler<Client>::handle(HTTPHandler<Client> *this,Client *client)

{
  ostream *poVar1;
  size_t sVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  Request request;
  Response resp;
  istream *local_1a0;
  path local_198;
  Request local_170;
  Response local_f0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"\r\n\r\n",(allocator<char> *)&local_170);
  Client::read_until<std::__cxx11::stringstream>((Client *)&local_1a0,(string *)client);
  std::__cxx11::string::~string((string *)&local_f0);
  if (local_1a0 != (istream *)0x0) {
    Request::Request(&local_170,local_1a0);
    poVar1 = std::operator<<(this->stream,"---------- Request ----------");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = operator<<(poVar1,&local_170);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"-----------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::filesystem::__cxx11::path::path(&local_198,&this->resolve_path);
    Response::Response(&local_f0,&local_170,&local_198);
    std::filesystem::__cxx11::path::~path(&local_198);
    sVar2 = Response::get_content_length(&local_f0);
    if (sVar2 < 200) {
      poVar1 = std::operator<<(this->stream,"---------- Response ----------");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      pbVar3 = operator<<(poVar1,&local_f0);
      poVar1 = std::endl<char,std::char_traits<char>>(pbVar3);
      poVar1 = std::operator<<(poVar1,"------------------------------");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    operator<<(client,&local_f0);
    Response::~Response(&local_f0);
    Request::~Request(&local_170);
    if (local_1a0 != (istream *)0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  return;
}

Assistant:

void HTTPHandler<T>::handle(T&& client) {
    auto result = client.read_until("\r\n\r\n");

    if (!result) {
        return;
    }

    Request request(*result);
    stream << "---------- Request ----------" << std::endl
           << request                         << std::endl
           << "-----------------------------" << std::endl;

    Response resp(request, resolve_path);
    if (resp.get_content_length() < 200) {
        stream << "---------- Response ----------" << std::endl
               << resp                             << std::endl
               << "------------------------------" << std::endl;
    }

    client << resp;
}